

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O2

uint64_t helper_autda_aarch64(CPUARMState_conflict *env,uint64_t x,uint64_t y)

{
  _Bool _Var1;
  int el;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  
  el = arm_current_el(env);
  _Var1 = pauth_key_enabled(env,el,0x8000000);
  if (_Var1) {
    pauth_check_trap(env,el,unaff_retaddr);
    uVar2 = pauth_auth(env,x,y,&(env->keys).apda,true,0);
    return uVar2;
  }
  return x;
}

Assistant:

uint64_t HELPER(autda)(CPUARMState *env, uint64_t x, uint64_t y)
{
    int el = arm_current_el(env);
    if (!pauth_key_enabled(env, el, SCTLR_EnDA)) {
        return x;
    }
    pauth_check_trap(env, el, GETPC());
    return pauth_auth(env, x, y, &env->keys.apda, true, 0);
}